

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O1

void vkt::texture::util::calcCubemapFaceCoords
               (Vec3 *r,Vec3 *drdx,Vec3 *drdy,int faceNdx,Vec2 *coordFace,Vec2 *dPdxFace,
               Vec2 *dPdyFace)

{
  float fVar1;
  int iVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float local_48 [4];
  float local_38 [2];
  Vec3 coordC;
  Vec3 dPcdy;
  Vec3 dPcdx;
  
  lVar3 = 0;
  local_48[2] = 0.0;
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  stack0xffffffffffffffd8 = 0;
  coordC.m_data[0] = 0.0;
  local_38[0] = 0.0;
  local_38[1] = 0.0;
  do {
    iVar2 = *(int *)((long)calcCubemapFaceCoords::compMap[faceNdx] + lVar3);
    fVar4 = (float)*(int *)((long)calcCubemapFaceCoords::signMap[faceNdx] + lVar3);
    *(float *)((long)local_48 + lVar3) = r->m_data[iVar2] * fVar4;
    *(float *)((long)coordC.m_data + lVar3 + 8) = drdx->m_data[iVar2] * fVar4;
    *(float *)((long)coordC.m_data + lVar3 + -8) = fVar4 * drdy->m_data[iVar2];
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0xc);
  fVar4 = -local_48[2];
  if (-local_48[2] <= local_48[2]) {
    fVar4 = local_48[2];
  }
  fVar5 = -fVar4;
  if (-fVar4 <= fVar4) {
    fVar5 = fVar4;
  }
  lVar3 = 0;
  do {
    fVar1 = *(float *)((long)local_48 + lVar3);
    *(float *)((long)coordFace->m_data + lVar3) = (fVar1 * 0.5) / fVar5 + 0.5;
    *(float *)((long)dPdxFace->m_data + lVar3) =
         ((*(float *)((long)coordC.m_data + lVar3 + 8) * fVar5 - fVar1 * 0.0) * 0.5) /
         (fVar4 * fVar4);
    *(float *)((long)dPdyFace->m_data + lVar3) =
         ((*(float *)((long)coordC.m_data + lVar3 + -8) * fVar5 - fVar1 * coordC.m_data[0]) * 0.5) /
         (fVar4 * fVar4);
    lVar3 = lVar3 + 4;
  } while (lVar3 == 4);
  return;
}

Assistant:

void calcCubemapFaceCoords (const Vec3& r,
							const Vec3& drdx,
							const Vec3& drdy,
							const int	faceNdx,
							Vec2&		coordFace,
							Vec2&		dPdxFace,
							Vec2&		dPdyFace)
{
	DE_ASSERT(faceNdx >= 0 && faceNdx < 6);

	static const int compMap[6][3] =
	{
		{2, 1, 0},
		{2, 1, 0},
		{0, 2, 1},
		{0, 2, 1},
		{0, 1, 2},
		{0, 1, 2}
	};

	static const int signMap[6][3] =
	{
		{-1, -1, +1},
		{+1, -1, -1},
		{+1, +1, +1},
		{+1, -1, -1},
		{+1, -1, +1},
		{-1, -1, -1}
	};

	Vec3 coordC;
	Vec3 dPcdx;
	Vec3 dPcdy;

	for (int compNdx = 0; compNdx < 3; ++compNdx)
	{
		const int	mappedComp = compMap[faceNdx][compNdx];
		const int	mappedSign = signMap[faceNdx][compNdx];

		coordC[compNdx] = r   [mappedComp]	* (float)mappedSign;
		dPcdx [compNdx]	= drdx[mappedComp]	* (float)mappedSign;
		dPcdy [compNdx]	= drdy[mappedComp]	* (float)mappedSign;
	}

	DE_ASSERT(coordC[2] != 0.0f);
	coordC[2] = de::abs(coordC[2]);

	for (int compNdx = 0; compNdx < 2; ++compNdx)
	{
		coordFace[compNdx] = 0.5f * coordC[compNdx] / de::abs(coordC[2]) + 0.5f;

		dPdxFace [compNdx] = 0.5f * (de::abs(coordC[2]) * dPcdx[compNdx] - coordC[compNdx] * dPcdx[2]) / (coordC[2] * coordC[2]);
		dPdyFace [compNdx] = 0.5f * (de::abs(coordC[2]) * dPcdy[compNdx] - coordC[compNdx] * dPcdy[2]) / (coordC[2] * coordC[2]);
	}
}